

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCommandCommand.cxx
# Opt level: O3

void __thiscall cmLoadedCommand::~cmLoadedCommand(cmLoadedCommand *this)

{
  char *__ptr;
  
  (this->super_cmCommand).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmLoadedCommand_005fc2f8;
  if ((this->info).Destructor != (CM_DESTRUCTOR_FUNCTION)0x0) {
    InstallSignalHandlers((this->info).Name,0);
    (*(this->info).Destructor)(&this->info);
    InstallSignalHandlers((this->info).Name,1);
  }
  __ptr = (this->info).Error;
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  cmCommand::~cmCommand(&this->super_cmCommand);
  return;
}

Assistant:

cmLoadedCommand::~cmLoadedCommand()
{
  if (this->info.Destructor)
    {
    cmLoadedCommand::InstallSignalHandlers(info.Name);
    this->info.Destructor((void *)&this->info);
    cmLoadedCommand::InstallSignalHandlers(info.Name, 1);
    }
  if (this->info.Error)
    {
    free(this->info.Error);
    }
}